

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derLDec(size_t *len,octet *der,size_t count)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (count != 0) {
    bVar1 = *der;
    uVar2 = (ulong)bVar1;
    if ((bVar1 != 0x80) && (bVar1 != 0xff)) {
      if (-1 < (char)bVar1) {
        sVar3 = 1;
LAB_00110e0f:
        if (len != (size_t *)0x0) {
          *len = uVar2;
        }
        return sVar3;
      }
      uVar4 = (ulong)(bVar1 & 0x7f);
      if ((((bVar1 & 0x7f) < 9 && uVar4 < count) && (der[1] != '\0')) &&
         ((bVar1 & 0x7f) != 1 || (char)der[1] < '\0')) {
        sVar3 = uVar4 + 1;
        uVar2 = 0;
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          uVar2 = uVar2 << 8 | (ulong)der[uVar5 + 1];
        }
        if (uVar2 != 0xffffffffffffffff) goto LAB_00110e0f;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t derLDec(size_t* len, const octet der[], size_t count)
{
	size_t l_count = 1;
	size_t l;
	// не хватает буфера? неявная форма (0x80)? запрещенный октет (0xFF)?
	if (count < l_count || der[0] == 128 || der[0] == 255)
		return SIZE_MAX;
	// короткая форма?
	if (der[0] < 128)
		l = der[0];
	// длинная форма
	else
	{
		size_t r = der[0] - 128;
		l_count += r;
		// не хватает буфера? переполнение?
		// нулевой старший октет кода длины?
		// длина меньше 128?
		if (count < l_count || r > O_PER_S ||
			der[1] == 0 || 
			r == 1 && der[1] < 128)
			return SIZE_MAX;
		for (l = 0, r = 1; r < l_count; ++r)
			 l <<= 8, l |= (size_t)der[r];
		// переполнение?
		if (l == SIZE_MAX)
			return SIZE_MAX;
	}
	// возврат
	if (len)
	{
		ASSERT(memIsValid(len, sizeof(size_t)));
		*len = l;
	}
	return l_count;
}